

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cfd_psbt.cpp
# Opt level: O2

uint32_t __thiscall cfd::Psbt::AddTxInData(Psbt *this,UtxoData *utxo,uint32_t sequence)

{
  uint32_t uVar1;
  vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_> key_list;
  AbstractTxOutReference local_120;
  OutPoint outpoint;
  Script redeem_script;
  TxOut txout;
  
  cfd::core::OutPoint::OutPoint(&outpoint,&utxo->txid,utxo->vout);
  cfd::core::TxOut::TxOut(&txout);
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_list.super__Vector_base<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  cfd::core::Script::Script(&redeem_script);
  ConvertFromUtxoData(utxo,(OutPoint *)0x0,&txout,&key_list,&redeem_script,false,(NetType *)0x0);
  uVar1 = AddTxIn(this,&outpoint,sequence);
  cfd::core::TxOutReference::TxOutReference((TxOutReference *)&local_120,&txout);
  cfd::core::Psbt::SetTxInUtxo
            ((uint)this,(TxOutReference *)(ulong)uVar1,(Script *)&local_120,(vector *)&redeem_script
            );
  core::AbstractTxOutReference::~AbstractTxOutReference(&local_120);
  core::Script::~Script(&redeem_script);
  std::vector<cfd::core::KeyData,_std::allocator<cfd::core::KeyData>_>::~vector(&key_list);
  core::AbstractTxOut::~AbstractTxOut(&txout.super_AbstractTxOut);
  core::Txid::~Txid(&outpoint.txid_);
  return uVar1;
}

Assistant:

uint32_t Psbt::AddTxInData(const UtxoData& utxo, uint32_t sequence) {
  OutPoint outpoint(utxo.txid, utxo.vout);
  TxOut txout;
  std::vector<KeyData> key_list;
  Script redeem_script;
  ConvertFromUtxoData(utxo, nullptr, &txout, &key_list, &redeem_script);

  uint32_t index = AddTxIn(outpoint, sequence);
  try {
    cfd::core::Psbt::SetTxInUtxo(
        index, TxOutReference(txout), redeem_script, key_list);
  } catch (const CfdException& except) {
    struct wally_psbt* psbt_pointer;
    psbt_pointer = static_cast<struct wally_psbt*>(wally_psbt_pointer_);
    wally_psbt_remove_input(psbt_pointer, index);
    base_tx_ = cfd::core::Psbt::RebuildTransaction(wally_psbt_pointer_);
    throw except;
  }
  return index;
}